

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O3

int main(int argc,char **argv)

{
  _Rb_tree_color _Var1;
  undefined1 auVar2 [16];
  bool bVar3;
  uint uVar4;
  int iVar5;
  char *pcVar6;
  iterator iVar7;
  _Base_ptr p_Var8;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var9;
  _Result_base *this;
  long lVar10;
  undefined8 extraout_RAX;
  undefined8 extraout_RAX_00;
  undefined8 uVar11;
  ostream *poVar12;
  _State_baseV2 *__tmp;
  _Base_ptr p_Var13;
  int i;
  int iVar14;
  int iVar15;
  size_t sVar16;
  _Base_ptr p_Var17;
  long lVar18;
  _Base_ptr p_Var19;
  int j;
  ulong uVar20;
  pair<int,_int> pVar21;
  uint uVar22;
  ulong uVar23;
  pair<int,_int> pVar24;
  long lVar25;
  undefined1 auVar26 [32];
  char **matrix;
  shared_ptr<std::__future_base::_State_baseV2> __state;
  indexArrayType indexArray;
  vector<std::future<void>,_std::allocator<std::future<void>_>_> futArr;
  adjacencyType DFA;
  adjacencyType RFA;
  startStatesType startStatesRFA;
  __m256i ik;
  finalStatesType finalStatesRFA;
  char **local_268;
  undefined1 local_260 [8];
  _Alloc_hider _Stack_258;
  undefined1 local_250 [32];
  _Rb_tree_node_base *local_230;
  element_type *local_228;
  _Base_ptr local_220;
  uint local_214;
  vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_> local_210;
  long *local_1f0;
  int local_1e4;
  __shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2> local_1e0;
  size_type local_1d0;
  size_t local_1c0;
  ulong local_1b8;
  vector<std::future<void>,_std::allocator<std::future<void>_>_> local_1b0;
  undefined1 local_190 [16];
  pointer local_180;
  vector<edge,_std::allocator<edge>_> local_170;
  undefined1 local_150 [16];
  pointer local_140;
  time_point local_138;
  long local_130;
  ulong local_128;
  long local_120;
  char *local_118;
  _Base_ptr local_110;
  _Base_ptr local_108;
  __basic_future<void> local_100;
  _Rb_tree<int,_std::pair<const_int,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_std::_Select1st<std::pair<const_int,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>
  local_f0;
  undefined1 *local_c0;
  undefined1 *puStack_b8;
  undefined1 *puStack_b0;
  undefined1 *puStack_a8;
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<int,_std::allocator<int>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<int,_std::allocator<int>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<int,_std::allocator<int>_>_>_>_>
  local_88;
  
  local_f0._M_impl.super__Rb_tree_header._M_header._M_left =
       &local_f0._M_impl.super__Rb_tree_header._M_header;
  local_88._M_impl.super__Rb_tree_header._M_header._M_left =
       &local_88._M_impl.super__Rb_tree_header._M_header;
  local_140 = (pointer)0x0;
  local_f0._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  local_f0._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  local_88._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  local_88._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  local_150 = (undefined1  [16])0x0;
  local_f0._M_impl.super__Rb_tree_header._M_node_count = 0;
  local_88._M_impl.super__Rb_tree_header._M_node_count = 0;
  local_f0._M_impl.super__Rb_tree_header._M_header._M_right =
       local_f0._M_impl.super__Rb_tree_header._M_header._M_left;
  local_88._M_impl.super__Rb_tree_header._M_header._M_right =
       local_88._M_impl.super__Rb_tree_header._M_header._M_left;
  std::__cxx11::string::string((string *)local_260,argv[1],(allocator *)&local_c0);
  readRFA((string *)local_260,(adjacencyType *)local_150,(startStatesType *)&local_f0,
          (finalStatesType *)&local_88,&numOfStatesRFA);
  if (local_260 != (undefined1  [8])local_250) {
    operator_delete((void *)local_260,local_250._0_8_ + 1);
  }
  local_180 = (pointer)0x0;
  local_1d0 = 0;
  local_190 = (undefined1  [16])0x0;
  local_1e0._M_ptr = (element_type *)0x0;
  local_1e0._M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  std::__cxx11::string::string((string *)local_260,argv[2],(allocator *)&local_c0);
  readDFA((string *)local_260,(adjacencyType *)local_190,&numOfStatesDFA,
          (vector<edge,_std::allocator<edge>_> *)&local_1e0);
  if (local_260 != (undefined1  [8])local_250) {
    operator_delete((void *)local_260,local_250._0_8_ + 1);
  }
  uVar23 = (long)numOfStatesRFA * (long)numOfStatesDFA;
  uVar22 = (uint)uVar23;
  uVar20 = 0xffffffffffffffff;
  uVar4 = uVar22 + 0x1f;
  if (-1 < (int)uVar22) {
    uVar20 = uVar23 * 8;
    uVar4 = uVar22;
  }
  sVar16 = (size_t)((uVar4 & 0xffffffe0) + 0x20);
  if (uVar22 == (uVar4 & 0xffffffe0)) {
    sVar16 = uVar23 & 0xffffffff;
  }
  matrixSize = uVar22;
  local_268 = (char **)operator_new__(uVar20);
  iVar5 = (int)sVar16;
  if (0 < (int)uVar22) {
    lVar25 = 0;
    do {
      pcVar6 = (char *)operator_new__((long)iVar5);
      local_268[lVar25] = pcVar6;
      if (0 < iVar5) {
        memset(local_268[lVar25],0,sVar16);
        uVar23 = (ulong)(uint)matrixSize;
      }
      lVar25 = lVar25 + 1;
    } while (lVar25 < (int)uVar23);
  }
  local_1c0 = sVar16;
  local_138.__d.__r = (duration)std::chrono::_V2::steady_clock::now();
  if ((_Rb_tree_header *)local_f0._M_impl.super__Rb_tree_header._M_header._M_left !=
      &local_f0._M_impl.super__Rb_tree_header) {
    p_Var8 = local_f0._M_impl.super__Rb_tree_header._M_header._M_left;
    do {
      local_220 = p_Var8[1]._M_left;
      p_Var13 = p_Var8[1]._M_parent;
      local_230 = p_Var8;
      if (p_Var13 != local_220) {
        local_228 = (element_type *)CONCAT44(local_228._4_4_,p_Var8[1]._M_color);
        do {
          iVar7 = std::
                  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<int,_std::allocator<int>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<int,_std::allocator<int>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<int,_std::allocator<int>_>_>_>_>
                  ::find(&local_88,(key_type *)p_Var13);
          p_Var19 = iVar7._M_node[2]._M_parent;
          iVar15 = numOfStatesDFA;
          for (p_Var8 = *(_Base_ptr *)(iVar7._M_node + 2); p_Var8 != p_Var19;
              p_Var8 = (_Base_ptr)&p_Var8->field_0x4) {
            if (((_Rb_tree_color)local_228 == p_Var8->_M_color) && (0 < iVar15)) {
              iVar14 = 0;
              do {
                insertToFiniteAutomation((adjacencyType *)local_190,iVar14,iVar14,(string *)p_Var13)
                ;
                iVar14 = iVar14 + 1;
                iVar15 = numOfStatesDFA;
              } while (iVar14 < numOfStatesDFA);
            }
          }
          p_Var13 = p_Var13 + 1;
        } while (p_Var13 != local_220);
      }
      p_Var8 = (_Base_ptr)std::_Rb_tree_increment(local_230);
    } while ((_Rb_tree_header *)p_Var8 != &local_f0._M_impl.super__Rb_tree_header);
  }
  uVar4 = std::thread::hardware_concurrency();
  local_214 = (uint)matrixSize / uVar4;
  local_210.super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pair<int,_int> *)0x0;
  local_c0 = &DAT_101010101010101;
  puStack_b8 = &DAT_101010101010101;
  puStack_b0 = &DAT_101010101010101;
  puStack_a8 = &DAT_101010101010101;
  local_210.super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_210.super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>::reserve
            (&local_210,(ulong)(uint)(numOfStatesRFA * numOfStatesDFA));
  if (0 < numOfStatesDFA) {
    pVar24.first = 0;
    pVar24.second = 0;
    iVar15 = numOfStatesDFA;
    iVar14 = numOfStatesRFA;
    do {
      if (0 < iVar14) {
        lVar25 = 0;
        pVar21 = pVar24;
        do {
          local_260 = (undefined1  [8])pVar21;
          if (local_210.
              super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>._M_impl
              .super__Vector_impl_data._M_finish ==
              local_210.
              super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>._M_impl
              .super__Vector_impl_data._M_end_of_storage) {
            std::vector<std::pair<int,int>,std::allocator<std::pair<int,int>>>::
            _M_realloc_insert<std::pair<int,int>>
                      ((vector<std::pair<int,int>,std::allocator<std::pair<int,int>>> *)&local_210,
                       (iterator)
                       local_210.
                       super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>
                       ._M_impl.super__Vector_impl_data._M_finish,(pair<int,_int> *)local_260);
            iVar14 = numOfStatesRFA;
          }
          else {
            *local_210.
             super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>._M_impl.
             super__Vector_impl_data._M_finish = pVar21;
            local_210.super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>
            ._M_impl.super__Vector_impl_data._M_finish =
                 local_210.
                 super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>.
                 _M_impl.super__Vector_impl_data._M_finish + 1;
          }
          lVar25 = lVar25 + 1;
          pVar21 = (pair<int,_int>)((long)pVar21 + 0x100000000);
          iVar15 = numOfStatesDFA;
        } while (lVar25 < iVar14);
      }
      pVar24 = (pair<int,_int>)((long)pVar24 + 1);
    } while ((long)pVar24 < (long)iVar15);
  }
  uVar4 = uVar4 - 1;
  local_1e4 = local_214 * uVar4;
  local_128 = (ulong)uVar4;
  local_120 = local_128 << 4;
  local_130 = (long)local_1e4;
  sVar16 = local_1c0;
  while( true ) {
    updateMatrix((vector<edge,_std::allocator<edge>_> *)&local_1e0,(adjacencyType *)local_150,
                 local_268);
    local_1b0.super__Vector_base<std::future<void>,_std::allocator<std::future<void>_>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    local_1b0.super__Vector_base<std::future<void>,_std::allocator<std::future<void>_>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    local_1b0.super__Vector_base<std::future<void>,_std::allocator<std::future<void>_>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    std::vector<std::future<void>,_std::allocator<std::future<void>_>_>::reserve
              (&local_1b0,local_128);
    if (uVar4 != 0) {
      iVar15 = 0;
      uVar22 = uVar4;
      do {
        local_260 = (undefined1  [8])0x0;
        _Stack_258._M_p = (pointer)0x0;
        _Var9._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)operator_new(0x68);
        (_Var9._M_pi)->_M_use_count = 1;
        (_Var9._M_pi)->_M_weak_count = 1;
        (_Var9._M_pi)->_vptr__Sp_counted_base = (_func_int **)&PTR___Sp_counted_ptr_inplace_00121b98
        ;
        local_228 = (element_type *)(_Var9._M_pi + 1);
        _Var9._M_pi[1]._M_use_count = 0;
        _Var9._M_pi[1]._M_weak_count = 0;
        *(undefined4 *)&_Var9._M_pi[2]._vptr__Sp_counted_base = 0;
        *(undefined1 *)((long)&_Var9._M_pi[2]._vptr__Sp_counted_base + 4) = 0;
        _Var9._M_pi[2]._M_use_count = 0;
        _Var9._M_pi[3]._vptr__Sp_counted_base = (_func_int **)0x0;
        _Var9._M_pi[3]._M_use_count = 0;
        _Var9._M_pi[1]._vptr__Sp_counted_base = (_func_int **)&PTR___Async_state_impl_00121be8;
        this = (_Result_base *)operator_new(0x10);
        *(undefined1 (*) [16])this = (undefined1  [16])0x0;
        std::__future_base::_Result_base::_Result_base(this);
        _Var9._M_pi[4]._vptr__Sp_counted_base = (_func_int **)this;
        auVar2._8_8_ = 0;
        auVar2._0_8_ = local_170.super__Vector_base<edge,_std::allocator<edge>_>._M_impl.
                       super__Vector_impl_data._M_finish;
        local_170.super__Vector_base<edge,_std::allocator<edge>_>._M_impl.super__Vector_impl_data.
        _0_16_ = auVar2 << 0x40;
        *(undefined ***)this = &PTR__M_destroy_00121d08;
        _Var9._M_pi[4]._M_use_count = local_214;
        _Var9._M_pi[4]._M_weak_count = iVar15 * local_214;
        _Var9._M_pi[5]._vptr__Sp_counted_base = (_func_int **)&local_268;
        *(undefined1 ***)&_Var9._M_pi[5]._M_use_count = &local_c0;
        *(int *)&_Var9._M_pi[6]._vptr__Sp_counted_base = iVar5;
        local_1f0 = (long *)operator_new(0x20);
        *local_1f0 = (long)&PTR___State_00121c40;
        local_1f0[1] = (long)local_228;
        local_1f0[2] = (long)std::__future_base::
                             _Async_state_impl<std::thread::_Invoker<std::tuple<(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/IvanTyulyandin[P]challenge/main.cpp:142:28),_int,_int>_>,_void>
                             ::_M_run;
        local_1f0[3] = 0;
        std::thread::_M_start_thread(&local_170,&local_1f0,0);
        if (local_1f0 != (long *)0x0) {
          (**(code **)(*local_1f0 + 8))();
        }
        if (_Var9._M_pi[3]._vptr__Sp_counted_base != (_func_int **)0x0) {
          std::terminate();
        }
        _Var9._M_pi[3]._vptr__Sp_counted_base =
             (_func_int **)
             local_170.super__Vector_base<edge,_std::allocator<edge>_>._M_impl.
             super__Vector_impl_data._M_start;
        _Stack_258._M_p = (pointer)_Var9._M_pi;
        local_260 = (undefined1  [8])local_228;
        std::__basic_future<void>::__basic_future(&local_100,(__state_type *)local_260);
        if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)_Stack_258._M_p !=
            (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                    ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)_Stack_258._M_p);
        }
        std::vector<std::future<void>,std::allocator<std::future<void>>>::
        emplace_back<std::future<void>>
                  ((vector<std::future<void>,std::allocator<std::future<void>>> *)&local_1b0,
                   (future<void> *)&local_100);
        if (local_100._M_state.
            super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>.
            _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                    (local_100._M_state.
                     super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>
                     ._M_refcount._M_pi);
        }
        iVar15 = iVar15 + 1;
        uVar22 = uVar22 - 1;
      } while (uVar22 != 0);
    }
    iVar15 = matrixSize;
    lVar10 = (long)matrixSize;
    lVar25 = local_130;
    if (0 < matrixSize - local_1e4) {
      do {
        if (0 < iVar15) {
          lVar18 = 0;
          do {
            if ((0 < iVar5) && (pcVar6 = local_268[lVar18], pcVar6[lVar25] != '\0')) {
              uVar20 = 0;
              do {
                auVar26._8_8_ = puStack_b8;
                auVar26._0_8_ = local_c0;
                auVar26._16_8_ = puStack_b0;
                auVar26._24_8_ = puStack_a8;
                auVar26 = vpternlogq_avx512vl(auVar26,*(undefined1 (*) [32])(pcVar6 + uVar20),
                                              *(undefined1 (*) [32])(local_268[lVar25] + uVar20),
                                              0xec);
                *(undefined1 (*) [32])(pcVar6 + uVar20) = auVar26;
                uVar20 = uVar20 + 0x20;
              } while (uVar20 < sVar16);
            }
            lVar18 = lVar18 + 1;
          } while (lVar18 != lVar10);
        }
        lVar25 = lVar25 + 1;
      } while (lVar25 < lVar10);
    }
    if (uVar4 != 0) {
      lVar25 = 0;
      do {
        std::future<void>::get
                  ((future<void> *)
                   ((long)&((local_1b0.
                             super__Vector_base<std::future<void>,_std::allocator<std::future<void>_>_>
                             ._M_impl.super__Vector_impl_data._M_start)->super___basic_future<void>)
                           ._M_state.
                           super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>
                           ._M_ptr + lVar25));
        lVar25 = lVar25 + 0x10;
      } while (local_120 != lVar25);
    }
    local_250._0_8_ = local_1d0;
    _local_260 = local_1e0;
    local_1d0 = 0;
    local_170.super__Vector_base<edge,_std::allocator<edge>_>._M_impl.super__Vector_impl_data.
    _M_end_of_storage = (pointer)0x0;
    local_1e0._M_ptr = (element_type *)0x0;
    local_1e0._M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    local_170.super__Vector_base<edge,_std::allocator<edge>_>._M_impl.super__Vector_impl_data.
    _M_start = (pointer)0x0;
    local_170.super__Vector_base<edge,_std::allocator<edge>_>._M_impl.super__Vector_impl_data.
    _M_finish = (pointer)0x0;
    std::vector<edge,_std::allocator<edge>_>::~vector
              ((vector<edge,_std::allocator<edge>_> *)local_260);
    std::vector<edge,_std::allocator<edge>_>::~vector(&local_170);
    if (matrixSize < 1) break;
    local_230 = (_Rb_tree_node_base *)0x0;
    local_1b8 = 0;
    iVar15 = matrixSize;
    do {
      if (local_f0._M_impl.super__Rb_tree_header._M_header._M_parent != (_Base_ptr)0x0) {
        local_118 = local_268[(long)local_230];
        iVar14 = local_210.
                 super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>.
                 _M_impl.super__Vector_impl_data._M_start[(long)local_230].second;
        p_Var8 = &local_f0._M_impl.super__Rb_tree_header._M_header;
        p_Var13 = local_f0._M_impl.super__Rb_tree_header._M_header._M_parent;
        do {
          p_Var19 = p_Var13;
          p_Var17 = p_Var8;
          _Var1 = p_Var19[1]._M_color;
          p_Var8 = p_Var19;
          if ((int)_Var1 < iVar14) {
            p_Var8 = p_Var17;
          }
          p_Var13 = (&p_Var19->_M_left)[(int)_Var1 < iVar14];
        } while ((&p_Var19->_M_left)[(int)_Var1 < iVar14] != (_Base_ptr)0x0);
        if ((_Rb_tree_header *)p_Var8 != &local_f0._M_impl.super__Rb_tree_header) {
          if ((int)_Var1 < iVar14) {
            p_Var19 = p_Var17;
          }
          if (0 < iVar15 && (int)p_Var19[1]._M_color <= iVar14) {
            p_Var13 = (_Base_ptr)0x0;
            local_110 = p_Var8;
            do {
              if (local_118[(long)p_Var13] != '\0') {
                local_108 = p_Var8[1]._M_left;
                p_Var19 = p_Var8[1]._M_parent;
                local_220 = p_Var13;
                if (p_Var19 != local_108) {
                  local_228 = (element_type *)
                              CONCAT44(local_228._4_4_,
                                       local_210.
                                       super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>
                                       ._M_impl.super__Vector_impl_data._M_start[(long)p_Var13].
                                       second);
                  do {
                    iVar7 = std::
                            _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<int,_std::allocator<int>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<int,_std::allocator<int>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<int,_std::allocator<int>_>_>_>_>
                            ::find(&local_88,(key_type *)p_Var19);
                    if ((_Rb_tree_header *)iVar7._M_node != &local_88._M_impl.super__Rb_tree_header)
                    {
                      p_Var13 = iVar7._M_node[2]._M_parent;
                      for (p_Var8 = *(_Base_ptr *)(iVar7._M_node + 2); p_Var8 != p_Var13;
                          p_Var8 = (_Base_ptr)&p_Var8->field_0x4) {
                        if (p_Var8->_M_color == (_Rb_tree_color)local_228) {
                          iVar15 = local_210.
                                   super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>
                                   ._M_impl.super__Vector_impl_data._M_start[(long)local_230].first;
                          iVar14 = local_210.
                                   super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>
                                   ._M_impl.super__Vector_impl_data._M_start[(long)local_220].first;
                          bVar3 = insertToFiniteAutomation
                                            ((adjacencyType *)local_190,iVar15,iVar14,
                                             (string *)p_Var19);
                          if (bVar3) {
                            local_260._4_4_ = iVar14;
                            local_260._0_4_ = iVar15;
                            _Stack_258._M_p = (pointer)(local_250 + 8);
                            std::__cxx11::string::_M_construct<char*>
                                      ((string *)(local_260 + 8),*(long *)p_Var19,
                                       (long)&p_Var19->_M_parent->_M_color + *(long *)p_Var19);
                            std::vector<edge,_std::allocator<edge>_>::emplace_back<edge>
                                      ((vector<edge,_std::allocator<edge>_> *)&local_1e0,
                                       (edge *)local_260);
                            uVar11 = extraout_RAX;
                            if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)_Stack_258._M_p !=
                                (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)(local_250 + 8)) {
                              operator_delete(_Stack_258._M_p,local_250._8_8_ + 1);
                              uVar11 = extraout_RAX_00;
                            }
                            local_1b8 = CONCAT71((int7)((ulong)uVar11 >> 8),1);
                          }
                        }
                      }
                    }
                    p_Var19 = p_Var19 + 1;
                    p_Var13 = local_220;
                    p_Var8 = local_110;
                    sVar16 = local_1c0;
                    iVar15 = matrixSize;
                  } while (p_Var19 != local_108);
                }
              }
              p_Var13 = (_Base_ptr)((long)&((_Alloc_hider *)&p_Var13->_M_color)->_M_p + 1);
            } while ((long)p_Var13 < (long)iVar15);
          }
        }
      }
      local_230 = (_Rb_tree_node_base *)((long)&local_230->_M_color + 1);
    } while ((long)local_230 < (long)iVar15);
    std::vector<std::future<void>,_std::allocator<std::future<void>_>_>::~vector(&local_1b0);
    if ((local_1b8 & 1) == 0) {
LAB_0011682c:
      local_260 = (undefined1  [8])local_250;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_260,"");
      getCurTime(local_138,(string *)local_260);
      if (local_260 != (undefined1  [8])local_250) {
        operator_delete((void *)local_260,local_250._0_8_ + 1);
      }
      iVar5 = countResult((adjacencyType *)local_190);
      poVar12 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,iVar5);
      std::__ostream_insert<char,std::char_traits<char>>(poVar12,"\n",1);
      if (0 < matrixSize) {
        lVar25 = 0;
        iVar5 = matrixSize;
        do {
          if (local_268[lVar25] != (char *)0x0) {
            operator_delete__(local_268[lVar25]);
            iVar5 = matrixSize;
          }
          lVar25 = lVar25 + 1;
        } while (lVar25 < iVar5);
      }
      if (local_268 != (char **)0x0) {
        operator_delete__(local_268);
      }
      if (local_210.super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>.
          _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_210.
                        super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>
                        ._M_impl.super__Vector_impl_data._M_start,
                        (long)local_210.
                              super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>
                              ._M_impl.super__Vector_impl_data._M_end_of_storage -
                        (long)local_210.
                              super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>
                              ._M_impl.super__Vector_impl_data._M_start);
      }
      std::vector<edge,_std::allocator<edge>_>::~vector
                ((vector<edge,_std::allocator<edge>_> *)&local_1e0);
      std::
      vector<std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::set<int,_std::less<int>,_std::allocator<int>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::set<int,_std::less<int>,_std::allocator<int>_>_>_>_>,_std::allocator<std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::set<int,_std::less<int>,_std::allocator<int>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::set<int,_std::less<int>,_std::allocator<int>_>_>_>_>_>_>
      ::~vector((vector<std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::set<int,_std::less<int>,_std::allocator<int>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::set<int,_std::less<int>,_std::allocator<int>_>_>_>_>,_std::allocator<std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::set<int,_std::less<int>,_std::allocator<int>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::set<int,_std::less<int>,_std::allocator<int>_>_>_>_>_>_>
                 *)local_190);
      std::
      _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<int,_std::allocator<int>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<int,_std::allocator<int>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<int,_std::allocator<int>_>_>_>_>
      ::~_Rb_tree(&local_88);
      std::
      _Rb_tree<int,_std::pair<const_int,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_std::_Select1st<std::pair<const_int,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>
      ::~_Rb_tree(&local_f0);
      std::
      vector<std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::set<int,_std::less<int>,_std::allocator<int>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::set<int,_std::less<int>,_std::allocator<int>_>_>_>_>,_std::allocator<std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::set<int,_std::less<int>,_std::allocator<int>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::set<int,_std::less<int>,_std::allocator<int>_>_>_>_>_>_>
      ::~vector((vector<std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::set<int,_std::less<int>,_std::allocator<int>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::set<int,_std::less<int>,_std::allocator<int>_>_>_>_>,_std::allocator<std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::set<int,_std::less<int>,_std::allocator<int>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::set<int,_std::less<int>,_std::allocator<int>_>_>_>_>_>_>
                 *)local_150);
      return 0;
    }
  }
  std::vector<std::future<void>,_std::allocator<std::future<void>_>_>::~vector(&local_1b0);
  goto LAB_0011682c;
}

Assistant:

int main(int argc, char* argv[]) {

    adjacencyType RFA;
    startStatesType startStatesRFA;
    finalStatesType finalStatesRFA;
    readRFA(argv[1], RFA, startStatesRFA, finalStatesRFA, numOfStatesRFA);

    adjacencyType DFA;
    vector<edge> newEdges = vector<edge>(0);
    readDFA(argv[2], DFA, numOfStatesDFA, newEdges);

	matrixSize = numOfStatesDFA * numOfStatesRFA;

	int matrixSizeTo32 = matrixSize % 32 == 0 ? matrixSize : matrixSize + (32 - matrixSize % 32); // for AVX2
	auto matrix = new char * [matrixSize];
    for (auto i = 0; i < matrixSize; ++ i) {
        matrix[i] = new char[matrixSizeTo32];
        char * matrixRow = matrix[i];
        for (auto j = 0; j < matrixSizeTo32; ++ j) {
            matrixRow[j] = 0;
        }
    }

	auto start_time = std::chrono::steady_clock::now();

    // add edges to automation, if nonterminal start == end
    for (auto & iter : startStatesRFA) {
        int startGrm = iter.first;
        for (auto & by : iter.second) {
            auto finalsIter = finalStatesRFA.find(by);
            // if it is equal to end iterator => incorrect input
            for (auto finalGrm : finalsIter->second) {
                if (startGrm == finalGrm) {
                    for (auto i = 0; i < numOfStatesDFA; ++ i) {
                        insertToFiniteAutomation(DFA, i, i, by);
                    }
                }
            }
        }
    }

    bool needOneMoreStep = false;


    auto THREADS = std::thread::hardware_concurrency() - 1;
    int step = matrixSize / (THREADS + 1);

    __m256i ik = _mm256_set1_epi8(1); // PogChamp

    auto parallelClosure = [&matrix, &ik, matrixSizeTo32](int startK, int howMuch) {
        int endK = startK + howMuch;
        for (auto k = startK; k < endK; ++ k) {
            for (auto i = 0; i < matrixSize; ++ i) {
                char * matrixRow = matrix[i];
                if (matrixRow[k]) {
					for (auto j = 0; j < matrixSizeTo32; j += 32) {
						__m256i ij = _mm256_loadu_si256((__m256i const *) &matrixRow[j]);
						__m256i kj = _mm256_loadu_si256((__m256i const *) &matrix[k][j]);

						_mm256_storeu_si256((__m256i *) &matrixRow[j], _mm256_or_si256(ij, _mm256_and_si256(ik, kj)));
					}
//					for (auto j = 0; j < matrixSize; ++ j) {
//						if (matrix[k][j]) {
//							matrixRow[j] = true;
//						}
//					}
                }
            }
        }
    };

	indexArrayType indexArray;
	indexArray.reserve(static_cast<unsigned int>(numOfStatesDFA * numOfStatesRFA));

	for (int i = 0; i < numOfStatesDFA; ++ i) {
		for (int j = 0; j < numOfStatesRFA; ++ j) {
			indexArray.emplace_back(make_pair(i, j));
		}
	}

    do {
        needOneMoreStep = false;

        // stage 1: add info about new edges to matrix
        updateMatrix(newEdges, RFA, matrix);

        //getCurTime(start_time, "1 stage done");


        vector<future<void>> futArr;
        futArr.reserve(THREADS);
        for (auto i = 0; i < THREADS; ++ i) {
            futArr.emplace_back(std::async(launch::async, parallelClosure, i * step, step));
        }

        parallelClosure(THREADS * step, matrixSize - THREADS * step);

        for (auto i = 0; i < THREADS; ++ i) {
            futArr[i].get();
        }

        // stage 2: closure
        //getCurTime(start_time, "2 stage done");

		//cout << countResult(DFA) << " before\n";
        newEdges = vector<edge>(0);
        for (auto i = 0; i < matrixSize; ++ i) {
            char * matrixRow = matrix[i];
            int startGrm = indexArray[i].second;
            auto nonTermStartIter = startStatesRFA.find(startGrm);
            if (nonTermStartIter != startStatesRFA.end()) {
                for (auto j = 0; j < matrixSize; ++ j) {
                    if (matrixRow[j]) {
                        int finalGrm = indexArray[j].second;
                        for (auto & nonTerm : nonTermStartIter->second) {
                            auto nonTermFinalIter = finalStatesRFA.find(nonTerm);
                            if (nonTermFinalIter != finalStatesRFA.end()) {
                                for (auto finalStateForNonTerm : nonTermFinalIter->second) {
                                    if (finalStateForNonTerm == finalGrm) {
                                        int startDFA = indexArray[i].first;
                                        int finalDFA = indexArray[j].first;
                                        if (insertToFiniteAutomation(DFA, startDFA, finalDFA, nonTerm)) {
											newEdges.emplace_back(move(edge(startDFA, finalDFA, nonTerm)));
											needOneMoreStep = true;
                                        }
                                    }
                                }
                            }
                        }
                    }
                }
            }

        }
        //getCurTime(start_time, "3 stage done");
		//cout << countResult(DFA) << " after\n";
    } while (needOneMoreStep);

    getCurTime(start_time, "");
    cout << countResult(DFA) << "\n";

    for (auto i = 0; i < matrixSize; ++ i) {
    	delete[](matrix[i]);
    }
    delete[](matrix);

}